

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O0

void __thiscall
sc_core::wif_sc_signed_trace::wif_sc_signed_trace
          (wif_sc_signed_trace *this,sc_signed *object_,string *name_,string *wif_name_)

{
  wif_trace *in_RCX;
  sc_signed *in_RSI;
  sc_signed *in_RDI;
  sc_signed *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  wif_trace::wif_trace
            (in_RCX,(string *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  (in_RDI->super_sc_value_base)._vptr_sc_value_base = (_func_int **)&PTR_write_003664a0;
  in_RDI[2].digit = (sc_digit *)in_RSI;
  sc_dt::sc_signed::length(in_RSI);
  sc_dt::sc_signed::sc_signed((sc_signed *)in_RCX,in_stack_ffffffffffffffdc);
  sc_dt::sc_signed::operator=(in_RDI,in_stack_ffffffffffffffb8);
  *(char **)&in_RDI[2].sgn = "BIT";
  return;
}

Assistant:

wif_sc_signed_trace::wif_sc_signed_trace(const sc_dt::sc_signed& object_,
					 const std::string& name_,
					 const std::string& wif_name_)
: wif_trace(name_, wif_name_), object(object_), old_value(object_.length())
{
    old_value = object;
    wif_type = "BIT";
}